

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O2

void emit_D3D_DCL(Context *ctx)

{
  RegisterType RVar1;
  uint uVar2;
  size_t in_RDX;
  char *pcVar3;
  char index_str [16];
  char dst [64];
  
  make_D3D_destarg_string(ctx,dst,in_RDX);
  index_str[0] = '\0';
  index_str[1] = '\0';
  index_str[2] = '\0';
  index_str[3] = '\0';
  index_str[4] = '\0';
  index_str[5] = '\0';
  index_str[6] = '\0';
  index_str[7] = '\0';
  index_str[8] = '\0';
  index_str[9] = '\0';
  index_str[10] = '\0';
  index_str[0xb] = '\0';
  index_str[0xc] = '\0';
  index_str[0xd] = '\0';
  index_str[0xe] = '\0';
  index_str[0xf] = '\0';
  RVar1 = (ctx->dest_arg).regtype;
  if (RVar1 == REG_TYPE_MISCTYPE) {
    if (1 < (uint)(ctx->dest_arg).regnum) {
      pcVar3 = "unknown misc register type";
LAB_00115931:
      fail(ctx,pcVar3);
      return;
    }
    pcVar3 = "";
  }
  else if (RVar1 == REG_TYPE_SAMPLER) {
    uVar2 = ctx->dwords[0] - 2;
    if (2 < uVar2) {
      pcVar3 = "unknown sampler texture type";
      goto LAB_00115931;
    }
    pcVar3 = &DAT_00126568 + *(int *)(&DAT_00126568 + (ulong)uVar2 * 4);
  }
  else {
    pcVar3 = usagestrs[ctx->dwords[0]];
    if (ctx->dwords[1] != 0) {
      snprintf(index_str,0x10,"%u");
    }
  }
  output_line(ctx,"dcl%s%s%s",pcVar3,index_str,dst);
  return;
}

Assistant:

static void emit_D3D_DCL(Context *ctx)
{
    char dst[64];
    make_D3D_destarg_string(ctx, dst, sizeof (dst));
    const DestArgInfo *arg = &ctx->dest_arg;
    const char *usage_str = "";
    char index_str[16] = { '\0' };

    if (arg->regtype == REG_TYPE_SAMPLER)
    {
        switch ((const TextureType) ctx->dwords[0])
        {
            case TEXTURE_TYPE_2D: usage_str = "_2d"; break;
            case TEXTURE_TYPE_CUBE: usage_str = "_cube"; break;
            case TEXTURE_TYPE_VOLUME: usage_str = "_volume"; break;
            default: fail(ctx, "unknown sampler texture type"); return;
        } // switch
    } // if

    else if (arg->regtype == REG_TYPE_MISCTYPE)
    {
        switch ((const MiscTypeType) arg->regnum)
        {
            case MISCTYPE_TYPE_POSITION:
            case MISCTYPE_TYPE_FACE:
                usage_str = "";  // just become "dcl vFace" or whatever.
                break;
            default: fail(ctx, "unknown misc register type"); return;
        } // switch
    } // else if

    else
    {
        const uint32 usage = ctx->dwords[0];
        const uint32 index = ctx->dwords[1];
        usage_str = usagestrs[usage];
        if (index != 0)
            snprintf(index_str, sizeof (index_str), "%u", (uint) index);
    } // else

    output_line(ctx, "dcl%s%s%s", usage_str, index_str, dst);
}